

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,Channel *aChannel)

{
  byte bVar1;
  ushort uVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  string __str_1;
  string __str;
  long *local_98;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = *(byte *)&(this->mContext).mNwkAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = 1;
  if (9 < bVar1) {
    uVar6 = 3 - (bVar1 < 100);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar6,(uint)bVar1);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x2637f7);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_68 = *plVar4;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*plVar3;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_88 = *plVar4;
    lStack_80 = plVar3[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar4;
    local_98 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  uVar2 = *(ushort *)
           ((long)&(this->mContext).mNwkAliases.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
  uVar6 = 1;
  if (((9 < uVar2) && (uVar6 = 2, 99 < uVar2)) && (uVar6 = 3, 999 < uVar2)) {
    uVar6 = 5 - (uVar2 < 10000);
  }
  local_78 = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,uVar6,(uint)uVar2);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x2637fd);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_88 = *plVar4;
    lStack_80 = plVar3[3];
    plVar5 = &local_88;
  }
  else {
    local_88 = *plVar4;
    plVar5 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar5);
  if (plVar5 != &local_88) {
    operator_delete(plVar5);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const Channel &aChannel)
{
    std::string ret;
    ret += "page=" + std::to_string(aChannel.mPage) + "\n";
    ret += "channel=" + std::to_string(aChannel.mNumber);
    return ret;
}